

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

void to_bottom_objects_undo_proc(Am_Object *command_obj)

{
  Am_Object local_20;
  Am_Value local_18;
  
  Am_Object::Am_Object(&local_20,command_obj);
  Am_Value::Am_Value(&local_18,&Am_No_Value);
  to_top_or_bottom_general_undo_redo(&local_20,true,false,false,false,&local_18);
  Am_Value::~Am_Value(&local_18);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, to_bottom_objects_undo,
                 (Am_Object command_obj))
{
  to_top_or_bottom_general_undo_redo(command_obj, true, false, false, false);
}